

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_format.cpp
# Opt level: O1

bool UnformatImage(string *path,Range range)

{
  bool bVar1;
  int def_cyls;
  int def_heads;
  shared_ptr<Disk> disk;
  shared_ptr<Disk> local_58;
  Range local_48;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_48._8_8_ = range._8_8_;
  local_48._0_8_ = range._0_8_;
  local_58.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Disk *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Disk,std::allocator<Disk>>
            (&local_58.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Disk **)&local_58,(allocator<Disk> *)&local_38);
  bVar1 = ReadImage(path,&local_58,true);
  if (bVar1) {
    def_cyls = Disk::cyls(local_58.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    def_heads = Disk::heads(local_58.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    ValidateRange(&local_48,0x80,2,1,def_cyls,def_heads);
    local_38._8_8_ = 0;
    pcStack_20 = std::
                 _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/cmd_format.cpp:87:16)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/cmd_format.cpp:87:16)>
               ::_M_manager;
    local_38._M_unused._M_object = &local_58;
    Range::each(&local_48,(function<void_(const_CylHead_&)> *)&local_38,false);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    bVar1 = WriteImage(path,&local_58);
  }
  else {
    bVar1 = false;
  }
  if (local_58.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return bVar1;
}

Assistant:

bool UnformatImage(const std::string& path, Range range)
{
    auto disk = std::make_shared<Disk>();
    if (!ReadImage(path, disk))
        return false;

    ValidateRange(range, MAX_TRACKS, MAX_SIDES, 1, disk->cyls(), disk->heads());

    range.each([&](const CylHead& cylhead) {
        Message(msgStatus, "Unformatting %s", CH(cylhead.cyl, cylhead.head));
        disk->write(cylhead, Track());
        });

    return WriteImage(path, disk);
}